

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

_Bool bad_domain(char *domain)

{
  int iVar1;
  char *pcVar2;
  _Bool _Var3;
  
  iVar1 = Curl_strcasecompare(domain,"localhost");
  if (iVar1 == 0) {
    pcVar2 = strchr(domain,0x2e);
    if (pcVar2 == (char *)0x0) {
      _Var3 = true;
    }
    else {
      _Var3 = pcVar2[1] == '\0';
    }
  }
  else {
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

static bool bad_domain(const char *domain)
{
  if(strcasecompare(domain, "localhost"))
    return FALSE;
  else {
    /* there must be a dot present, but that dot must not be a trailing dot */
    char *dot = strchr(domain, '.');
    if(dot)
      return dot[1] ? FALSE : TRUE;
  }
  return TRUE;
}